

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_serial_impl_deserialize.c
# Opt level: O1

metacall_deserialize_impl_ptr metacall_serial_impl_deserialize_func(type_id id)

{
  return metacall_serial_impl_deserialize_func::deserialize_func[id];
}

Assistant:

metacall_deserialize_impl_ptr metacall_serial_impl_deserialize_func(type_id id)
{
	static metacall_deserialize_impl_ptr deserialize_func[TYPE_SIZE] = {
		&metacall_serial_impl_deserialize_bool,
		&metacall_serial_impl_deserialize_char,
		&metacall_serial_impl_deserialize_short,
		&metacall_serial_impl_deserialize_int,
		&metacall_serial_impl_deserialize_long,
		&metacall_serial_impl_deserialize_float,
		&metacall_serial_impl_deserialize_double,
		&metacall_serial_impl_deserialize_string,
		&metacall_serial_impl_deserialize_buffer,
		&metacall_serial_impl_deserialize_array,
		&metacall_serial_impl_deserialize_map,
		&metacall_serial_impl_deserialize_ptr,
		metacall_serial_impl_deserialize_null
	};

	return deserialize_func[id];
}